

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O3

result * __thiscall
lest::expression_lhs<int_const&>::operator!=
          (result *__return_storage_ptr__,expression_lhs<int_const&> *this,optional<long> *rhs)

{
  bool bVar1;
  int iVar2;
  lest *this_00;
  long lVar3;
  optional<long> *in_R8;
  undefined1 *local_d8 [2];
  undefined1 local_c8 [16];
  undefined1 *local_b8;
  long local_b0;
  undefined1 local_a8 [16];
  undefined1 *local_98;
  long local_90;
  undefined1 local_88 [16];
  bool local_78;
  undefined1 *local_70;
  long local_68;
  undefined1 local_60 [16];
  string local_50;
  
  this_00 = *(lest **)this;
  iVar2 = *(int *)this_00;
  lVar3 = rhs->value_;
  bVar1 = rhs->has_value_;
  local_b8 = local_a8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"!=","");
  local_d8[0] = local_c8;
  std::__cxx11::string::_M_construct<char*>((string *)local_d8,local_b8,local_b8 + local_b0);
  to_string<int,nonstd::optional_bare::optional<long>>
            (&local_50,this_00,(int *)local_d8,(string *)rhs,in_R8);
  local_98 = local_88;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,local_50._M_dataplus._M_p,
             local_50._M_dataplus._M_p + local_50._M_string_length);
  local_78 = (bool)(bVar1 ^ 1U | lVar3 != iVar2);
  local_70 = local_60;
  std::__cxx11::string::_M_construct<char*>((string *)&local_70,local_98,local_98 + local_90);
  __return_storage_ptr__->passed = local_78;
  (__return_storage_ptr__->decomposition)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->decomposition).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&__return_storage_ptr__->decomposition,local_70,local_70 + local_68);
  if (local_70 != local_60) {
    operator_delete(local_70);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_d8[0] != local_c8) {
    operator_delete(local_d8[0]);
  }
  if (local_b8 != local_a8) {
    operator_delete(local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

result operator< ( R const & rhs ) { return result( lhs <  rhs, to_string( lhs, "<" , rhs ) ); }